

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O1

optional<pbrt::CameraWiSample> * __thiscall
pbrt::PerspectiveCamera::SampleWi
          (optional<pbrt::CameraWiSample> *__return_storage_ptr__,PerspectiveCamera *this,
          Interaction *ref,Point2f *u,SampledWavelengths *lambda)

{
  Interval<float> *pIVar1;
  float fVar2;
  undefined1 auVar3 [16];
  uintptr_t uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  Interval<float> IVar7;
  Interval<float> IVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  ulong uVar14;
  ulong uVar15;
  SampledWavelengths *lambda_00;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  undefined1 auVar21 [16];
  undefined8 uVar27;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar28 [56];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  Point3f PVar37;
  Vector3f VVar38;
  SampledSpectrum SVar39;
  SampledSpectrum Wi;
  Point2f pRaster;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined8 local_110;
  undefined8 uStack_108;
  Tuple2<pbrt::Point2,_float> local_100;
  undefined1 local_f8 [12];
  float fStack_ec;
  Interval<float> IStack_e8;
  Float FStack_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  Tuple3<pbrt::Normal3,_float> TStack_d0;
  float fStack_c4;
  float fStack_c0;
  undefined4 uStack_bc;
  MediumInterface *local_b8;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  TStack_b0;
  undefined1 local_a8 [16];
  Tuple3<pbrt::Vector3,_float> local_98;
  RayDifferential local_88;
  undefined1 auVar34 [56];
  
  fVar2 = (this->super_ProjectiveCamera).lensRadius;
  fVar17 = (u->super_Tuple2<pbrt::Point2,_float>).x;
  fVar20 = (u->super_Tuple2<pbrt::Point2,_float>).y;
  auVar18._0_4_ = fVar17 + fVar17;
  auVar18._4_4_ = fVar20 + fVar20;
  auVar18._8_8_ = 0;
  auVar29._8_4_ = 0xbf800000;
  auVar29._0_8_ = 0xbf800000bf800000;
  auVar29._12_4_ = 0xbf800000;
  auVar18 = vaddps_avx512vl(auVar18,auVar29);
  auVar29 = vmovshdup_avx(auVar18);
  fVar20 = auVar18._0_4_;
  fVar17 = auVar29._0_4_;
  if (fVar20 == 0.0) {
    auVar29 = ZEXT816(0) << 0x40;
    if ((fVar17 == 0.0) && (!NAN(fVar17))) goto LAB_00350e2a;
  }
  auVar19._8_4_ = 0x7fffffff;
  auVar19._0_8_ = 0x7fffffff7fffffff;
  auVar19._12_4_ = 0x7fffffff;
  auVar19 = vandps_avx512vl(auVar18,auVar19);
  auVar29 = vshufps_avx(auVar19,auVar19,0xf5);
  bVar5 = auVar29._0_4_ < auVar19._0_4_;
  auVar35._0_4_ = fVar20 / fVar17;
  auVar35._4_12_ = auVar18._4_12_;
  auVar29 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar35,ZEXT416(0x3fc90fdb));
  fVar16 = (float)((uint)bVar5 * (int)((fVar17 / fVar20) * 0.7853982) + (uint)!bVar5 * auVar29._0_4_
                  );
  fVar17 = (float)((uint)bVar5 * (int)fVar20 + (uint)!bVar5 * (int)fVar17);
  fVar20 = cosf(fVar16);
  fVar16 = sinf(fVar16);
  auVar29 = vinsertps_avx(ZEXT416((uint)(fVar17 * fVar20)),ZEXT416((uint)(fVar17 * fVar16)),0x10);
LAB_00350e2a:
  auVar21._0_4_ = fVar2 * auVar29._0_4_;
  auVar21._4_4_ = fVar2 * auVar29._4_4_;
  auVar21._8_4_ = fVar2 * auVar29._8_4_;
  auVar21._12_4_ = fVar2 * auVar29._12_4_;
  local_88.super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar21);
  local_88.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  uVar27 = 0;
  PVar37 = AnimatedTransform::operator()((AnimatedTransform *)this,(Point3f *)&local_88,ref->time);
  fVar17 = PVar37.super_Tuple3<pbrt::Point3,_float>.z;
  uStack_140 = (undefined4)uVar27;
  uStack_13c = (undefined4)((ulong)uVar27 >> 0x20);
  local_88.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_88.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_88.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z = 1.0;
  auVar28 = (undefined1  [56])0x0;
  VVar38 = AnimatedTransform::operator()((AnimatedTransform *)this,(Vector3f *)&local_88,ref->time);
  TStack_d0.z = VVar38.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar26._0_8_ = VVar38.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar26._8_56_ = auVar28;
  FStack_e0 = ref->time;
  TStack_b0.bits =
       (this->super_ProjectiveCamera).super_CameraBase.medium.
       super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
       .bits;
  auVar36._4_4_ = fVar17;
  auVar36._0_4_ = fVar17;
  auVar36._8_4_ = fVar17;
  auVar36._12_4_ = fVar17;
  auVar13._8_4_ = uStack_140;
  auVar13._0_8_ = PVar37.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar13._12_4_ = uStack_13c;
  _local_f8 = vpermilps_avx(auVar13,0x50);
  IStack_e8 = (Interval<float>)vmovlps_avx(auVar36);
  fStack_dc = 0.0;
  fStack_d8 = 0.0;
  fStack_d4 = 0.0;
  TStack_d0._0_8_ = vmovlps_avx(auVar26._0_16_);
  fStack_c4 = 0.0;
  fStack_c0 = 0.0;
  local_b8 = (MediumInterface *)0x0;
  auVar3._0_4_ = (ref->pi).super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
  auVar3._4_4_ = (ref->pi).super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar3._8_4_ = (ref->pi).super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
  auVar3._12_4_ =
       (ref->pi).super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
  fVar17 = (IStack_e8.low + IStack_e8.high) * 0.5 -
           ((ref->pi).super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
           (ref->pi).super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
  auVar29 = vinsertps_avx(_local_f8,ZEXT416((uint)fStack_ec),0x10);
  auVar22._0_4_ = (local_f8._4_4_ + auVar29._0_4_) * 0.5;
  auVar22._4_4_ = (local_f8._8_4_ + auVar29._4_4_) * 0.5;
  auVar22._8_4_ = (auVar29._8_4_ + 0.0) * 0.5;
  auVar22._12_4_ = (auVar29._12_4_ + 0.0) * 0.5;
  uVar27 = *(undefined8 *)
            &(ref->pi).super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar29 = vinsertps_avx(auVar3,ZEXT416((uint)(ref->pi).super_Point3<pbrt::Interval<float>_>.
                                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.
                                               high),0x10);
  auVar30._0_4_ = ((float)uVar27 + auVar29._0_4_) * 0.5;
  auVar30._4_4_ = ((float)((ulong)uVar27 >> 0x20) + auVar29._4_4_) * 0.5;
  auVar30._8_4_ = (auVar29._8_4_ + 0.0) * 0.5;
  auVar30._12_4_ = (auVar29._12_4_ + 0.0) * 0.5;
  auVar18 = vsubps_avx(auVar22,auVar30);
  auVar23._0_4_ = auVar18._0_4_ * auVar18._0_4_;
  auVar23._4_4_ = auVar18._4_4_ * auVar18._4_4_;
  auVar23._8_4_ = auVar18._8_4_ * auVar18._8_4_;
  auVar23._12_4_ = auVar18._12_4_ * auVar18._12_4_;
  auVar29 = vmovshdup_avx(auVar23);
  auVar29 = vfmadd231ss_fma(auVar29,auVar18,auVar18);
  auVar29 = vfmadd231ss_fma(auVar29,ZEXT416((uint)fVar17),ZEXT416((uint)fVar17));
  if (auVar29._0_4_ < 0.0) {
    fVar20 = sqrtf(auVar29._0_4_);
  }
  else {
    auVar29 = vsqrtss_avx(auVar29,auVar29);
    fVar20 = auVar29._0_4_;
  }
  auVar31._4_4_ = fVar20;
  auVar31._0_4_ = fVar20;
  auVar31._8_4_ = fVar20;
  auVar31._12_4_ = fVar20;
  auVar29 = vdivps_avx(auVar18,auVar31);
  auVar18 = vmovshdup_avx(auVar29);
  local_a8._0_4_ = fVar17 / fVar20;
  local_a8._4_12_ = SUB6012((undefined1  [60])0x0,0);
  fVar17 = (this->super_ProjectiveCamera).lensRadius;
  auVar18 = vfmadd132ss_fma(auVar18,ZEXT416((uint)((float)local_a8._0_4_ * TStack_d0.z)),
                            ZEXT416((uint)TStack_d0.y));
  auVar19 = vfmsub213ss_fma(ZEXT416((uint)TStack_d0.z),local_a8,
                            ZEXT416((uint)((float)local_a8._0_4_ * TStack_d0.z)));
  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(auVar18._0_4_ + auVar19._0_4_)),auVar29,
                            ZEXT416((uint)TStack_d0.x));
  local_100.x = 0.0;
  local_100.y = 0.0;
  auVar32._0_8_ = auVar29._0_8_ ^ 0x8000000080000000;
  auVar32._8_4_ = auVar29._8_4_ ^ 0x80000000;
  auVar32._12_4_ = auVar29._12_4_ ^ 0x80000000;
  auVar34 = ZEXT856(auVar32._8_8_);
  auVar24._0_4_ = -(float)local_a8._0_4_;
  auVar24._4_4_ = 0x80000000;
  auVar24._8_4_ = 0x80000000;
  auVar24._12_4_ = 0x80000000;
  auVar28 = ZEXT856(auVar24._8_8_);
  local_98._0_8_ = vmovlps_avx(auVar32);
  local_98.z = auVar24._0_4_;
  Interaction::SpawnRay(&local_88,(Interaction *)local_f8,(Vector3f *)&local_98);
  SVar39 = We(this,&local_88.super_Ray,lambda_00,(Point2f *)&local_100);
  auVar33._0_8_ = SVar39.values.values._8_8_;
  auVar33._8_56_ = auVar34;
  auVar25._0_8_ = SVar39.values.values._0_8_;
  auVar25._8_56_ = auVar28;
  auVar18 = vmovlhps_avx(auVar25._0_16_,auVar33._0_16_);
  local_110._0_4_ = auVar18._0_4_;
  if (((float)local_110 == 0.0) && (!NAN((float)local_110))) {
    uVar14 = 0;
    while (uVar15 = uVar14, uVar15 != 3) {
      fVar2 = *(float *)((long)&local_110 + uVar15 * 4 + 4);
      if ((fVar2 != 0.0) || (uVar14 = uVar15 + 1, NAN(fVar2))) break;
    }
    if (2 < uVar15) {
      auVar26 = ZEXT464(0) << 0x20;
      *(undefined1 (*) [64])((long)&__return_storage_ptr__->optionalValue + 0x90) = auVar26;
      *(undefined1 (*) [64])((long)&__return_storage_ptr__->optionalValue + 0x80) = auVar26;
      *(undefined1 (*) [64])((long)&__return_storage_ptr__->optionalValue + 0x40) = auVar26;
      *(undefined1 (*) [64])&__return_storage_ptr__->optionalValue = auVar26;
      return __return_storage_ptr__;
    }
  }
  uVar27 = vcmpss_avx512f(ZEXT416((uint)fVar17),ZEXT816(0) << 0x40,4);
  bVar5 = (bool)((byte)uVar27 & 1);
  auVar6._8_4_ = 0x7fffffff;
  auVar6._0_8_ = 0x7fffffff7fffffff;
  auVar6._12_4_ = 0x7fffffff;
  auVar19 = vandps_avx512vl(auVar19,auVar6);
  local_110 = auVar18._0_8_;
  uStack_108 = auVar18._8_8_;
  (__return_storage_ptr__->optionalValue).__align = local_110;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = uStack_108;
  IVar7 = (ref->pi).super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
  IVar8 = (ref->pi).super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
  uVar27 = *(undefined8 *)&ref->time;
  uVar9 = *(undefined8 *)&(ref->wo).super_Tuple3<pbrt::Vector3,_float>.y;
  uVar10 = *(undefined8 *)&(ref->n).super_Tuple3<pbrt::Normal3,_float>;
  uVar11 = *(undefined8 *)&(ref->n).super_Tuple3<pbrt::Normal3,_float>.z;
  uVar12 = *(undefined8 *)&(ref->uv).super_Tuple2<pbrt::Point2,_float>.y;
  *(Interval<float> *)((long)&__return_storage_ptr__->optionalValue + 0x28) =
       (ref->pi).super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
  *(Interval<float> *)((long)&__return_storage_ptr__->optionalValue + 0x30) = IVar7;
  *(Interval<float> *)((long)&__return_storage_ptr__->optionalValue + 0x38) = IVar8;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = uVar27;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = uVar9;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = uVar10;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = uVar11;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = uVar12;
  *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x68) = ref->mediumInterface;
  uVar4 = (ref->medium).
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  pIVar1 = (Interval<float> *)((long)&__return_storage_ptr__->optionalValue + 0x78);
  pIVar1->low = (float)local_f8._0_4_;
  pIVar1->high = (float)local_f8._4_4_;
  *(Interval<float> *)((long)&__return_storage_ptr__->optionalValue + 0x80) =
       stack0xffffffffffffff10;
  *(Interval<float> *)((long)&__return_storage_ptr__->optionalValue + 0x88) = IStack_e8;
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x90) = CONCAT44(fStack_dc,FStack_e0);
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x98) = CONCAT44(fStack_d4,fStack_d8);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = TStack_d0._0_8_;
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = CONCAT44(fStack_c4,TStack_d0.z);
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = CONCAT44(uStack_bc,fStack_c0);
  *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0xb8) = local_b8;
  __return_storage_ptr__->set = true;
  uVar27 = vmovlps_avx(auVar29);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar27;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = local_a8._0_4_;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x1c) =
       (fVar20 * fVar20) /
       ((float)((uint)bVar5 * (int)(fVar17 * fVar17 * 3.1415927) + (uint)!bVar5 * 0x3f800000) *
       auVar19._0_4_);
  *(Tuple2<pbrt::Point2,_float> *)((long)&__return_storage_ptr__->optionalValue + 0x20) = local_100;
  *(uintptr_t *)((long)&__return_storage_ptr__->optionalValue + 0x70) = uVar4;
  *(uintptr_t *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = TStack_b0.bits;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<CameraWiSample> PerspectiveCamera::SampleWi(
    const Interaction &ref, const Point2f &u, SampledWavelengths &lambda) const {
    // Uniformly sample a lens interaction _lensIntr_
    Point2f pLens = lensRadius * SampleUniformDiskConcentric(u);
    Point3f pLensRender = RenderFromCamera(Point3f(pLens.x, pLens.y, 0), ref.time);
    Normal3f n = Normal3f(RenderFromCamera(Vector3f(0, 0, 1), ref.time));
    Interaction lensIntr(pLensRender, n, ref.time, medium);

    // Populate arguments and compute the importance value
    // Compute incident direction to camera _wi_ at _ref_
    Vector3f wi = lensIntr.p() - ref.p();
    Float dist = Length(wi);
    wi /= dist;

    // Compute PDF for importance arriving at _ref_
    Float lensArea = lensRadius != 0 ? (Pi * lensRadius * lensRadius) : 1;
    Float pdf = (dist * dist) / (AbsDot(lensIntr.n, wi) * lensArea);

    Point2f pRaster;
    SampledSpectrum Wi = We(lensIntr.SpawnRay(-wi), lambda, &pRaster);
    if (!Wi)
        return {};
    return CameraWiSample(Wi, wi, pdf, pRaster, ref, lensIntr);
}